

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointSpline.cpp
# Opt level: O1

void __thiscall chrono::ChLinkPointSpline::ArchiveIN(ChLinkPointSpline *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkPointSpline>(marchive);
  ChLinkLockLock::ArchiveIN(&this->super_ChLinkLockLock,marchive);
  local_28._value = &this->trajectory_line;
  local_28._name = "trajectory_line";
  local_28._flags = '\0';
  ChArchiveIn::in<chrono::geometry::ChLine>(marchive,&local_28);
  return;
}

Assistant:

void ChLinkPointSpline::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkPointSpline>();

    // deserialize parent class
    ChLinkLockLock::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(trajectory_line);
}